

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdconnection.cc
# Opt level: O0

int __thiscall
bdConnectManager::requestConnection_direct
          (bdConnectManager *this,sockaddr_in *laddr,bdNodeId *target)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  pointer a;
  reference pbVar4;
  mapped_type *this_00;
  bdProxyId local_1f4;
  _Self local_1c8;
  _List_node_base *local_1c0;
  _Self local_1b8;
  _List_node_base *local_1b0;
  _Self local_1a8;
  _List_node_base *local_1a0;
  _List_iterator<bdProxyId> local_198;
  iterator git;
  iterator it;
  list<bdId,_std::allocator<bdId>_> matchIds;
  int with_flag;
  int number;
  bdProxyId local_15c;
  _Self local_130;
  _List_node_base *local_128;
  _List_iterator<bdId> local_120;
  iterator pit;
  list<bdId,_std::allocator<bdId>_> goodProxies;
  undefined1 local_f0 [8];
  bdConnectionRequest connreq;
  bdNodeId *target_local;
  sockaddr_in *laddr_local;
  bdConnectManager *this_local;
  
  connreq.mPeersTried.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>._M_impl._M_node.
  _M_size = (size_t)target;
  bdConnectionRequest::bdConnectionRequest((bdConnectionRequest *)local_f0);
  iVar2 = checkExistingConnectionAttempt
                    (this,(bdNodeId *)
                          connreq.mPeersTried.
                          super__List_base<bdProxyId,_std::allocator<bdProxyId>_>._M_impl._M_node.
                          _M_size);
  if (iVar2 == 0) {
    bdConnectionRequest::setupDirectConnection
              ((bdConnectionRequest *)local_f0,laddr,
               (bdNodeId *)
               connreq.mPeersTried.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>._M_impl.
               _M_node._M_size);
    std::__cxx11::list<bdId,_std::allocator<bdId>_>::list((list<bdId,_std::allocator<bdId>_> *)&pit)
    ;
    std::_List_iterator<bdId>::_List_iterator(&local_120);
    bdQueryManager::result
              (this->mQueryMgr,
               (bdNodeId *)
               connreq.mPeersTried.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>._M_impl.
               _M_node._M_size,(list<bdId,_std::allocator<bdId>_> *)&pit);
    local_128 = (_List_node_base *)
                std::__cxx11::list<bdId,_std::allocator<bdId>_>::begin
                          ((list<bdId,_std::allocator<bdId>_> *)&pit);
    local_120._M_node = local_128;
    while( true ) {
      local_130._M_node =
           (_List_node_base *)
           std::__cxx11::list<bdId,_std::allocator<bdId>_>::end
                     ((list<bdId,_std::allocator<bdId>_> *)&pit);
      bVar1 = std::operator!=(&local_120,&local_130);
      if (!bVar1) break;
      pbVar4 = std::_List_iterator<bdId>::operator*(&local_120);
      bdProxyId::bdProxyId(&local_15c,pbVar4,1,0);
      std::__cxx11::list<bdProxyId,_std::allocator<bdProxyId>_>::push_back
                ((list<bdProxyId,_std::allocator<bdProxyId>_> *)&connreq.mRequestTS,&local_15c);
      std::_List_iterator<bdId>::operator++(&local_120,0);
    }
    sVar3 = std::__cxx11::list<bdProxyId,_std::allocator<bdProxyId>_>::size
                      ((list<bdProxyId,_std::allocator<bdProxyId>_> *)&connreq.mRequestTS);
    if (sVar3 == 0) {
      std::__cxx11::list<bdId,_std::allocator<bdId>_>::list
                ((list<bdId,_std::allocator<bdId>_> *)&it);
      std::_List_iterator<bdId>::_List_iterator((_List_iterator<bdId> *)&git);
      std::_List_iterator<bdProxyId>::_List_iterator(&local_198);
      bdSpace::find_node(this->mNodeSpace,
                         (bdNodeId *)
                         connreq.mPeersTried.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>
                         ._M_impl._M_node._M_size,10,(list<bdId,_std::allocator<bdId>_> *)&it,0x200)
      ;
      local_1a0 = (_List_node_base *)
                  std::__cxx11::list<bdId,_std::allocator<bdId>_>::begin
                            ((list<bdId,_std::allocator<bdId>_> *)&it);
      git._M_node = local_1a0;
      while( true ) {
        local_1a8._M_node =
             (_List_node_base *)
             std::__cxx11::list<bdId,_std::allocator<bdId>_>::end
                       ((list<bdId,_std::allocator<bdId>_> *)&it);
        bVar1 = std::operator!=((_Self *)&git,&local_1a8);
        if (!bVar1) break;
        local_1b0 = (_List_node_base *)
                    std::__cxx11::list<bdProxyId,_std::allocator<bdProxyId>_>::begin
                              ((list<bdProxyId,_std::allocator<bdProxyId>_> *)&connreq.mRequestTS);
        local_198._M_node = local_1b0;
        while( true ) {
          local_1b8._M_node =
               (_List_node_base *)
               std::__cxx11::list<bdProxyId,_std::allocator<bdProxyId>_>::end
                         ((list<bdProxyId,_std::allocator<bdProxyId>_> *)&connreq.mRequestTS);
          bVar1 = std::operator!=(&local_198,&local_1b8);
          if (!bVar1) break;
          a = std::_List_iterator<bdProxyId>::operator->(&local_198);
          pbVar4 = std::_List_iterator<bdId>::operator*((_List_iterator<bdId> *)&git);
          iVar2 = ::operator==(&a->id,pbVar4);
          if (iVar2 != 0) break;
          local_1c0 = (_List_node_base *)std::_List_iterator<bdProxyId>::operator++(&local_198,0);
        }
        local_1c8._M_node =
             (_List_node_base *)
             std::__cxx11::list<bdProxyId,_std::allocator<bdProxyId>_>::end
                       ((list<bdProxyId,_std::allocator<bdProxyId>_> *)&connreq.mRequestTS);
        bVar1 = std::operator==(&local_198,&local_1c8);
        if (bVar1) {
          pbVar4 = std::_List_iterator<bdId>::operator*((_List_iterator<bdId> *)&git);
          bdProxyId::bdProxyId(&local_1f4,pbVar4,5,0);
          std::__cxx11::list<bdProxyId,_std::allocator<bdProxyId>_>::push_back
                    ((list<bdProxyId,_std::allocator<bdProxyId>_> *)&connreq.mRequestTS,&local_1f4);
        }
        std::_List_iterator<bdId>::operator++((_List_iterator<bdId> *)&git,0);
      }
      std::__cxx11::list<bdId,_std::allocator<bdId>_>::~list
                ((list<bdId,_std::allocator<bdId>_> *)&it);
    }
    sVar3 = std::__cxx11::list<bdProxyId,_std::allocator<bdProxyId>_>::size
                      ((list<bdProxyId,_std::allocator<bdProxyId>_> *)&connreq.mRequestTS);
    if (1 < sVar3) {
      std::operator<<((ostream *)&std::cerr,
                      "bdConnectManager::requestConnection_direct() ERROR Multiple Peers for DIRECT connection"
                     );
      std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
    }
    this_00 = std::
              map<bdNodeId,_bdConnectionRequest,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdConnectionRequest>_>_>
              ::operator[](&this->mConnectionRequests,
                           (key_type *)
                           connreq.mPeersTried.
                           super__List_base<bdProxyId,_std::allocator<bdProxyId>_>._M_impl._M_node.
                           _M_size);
    bdConnectionRequest::operator=(this_00,(bdConnectionRequest *)local_f0);
    this_local._4_4_ = 1;
    std::__cxx11::list<bdId,_std::allocator<bdId>_>::~list
              ((list<bdId,_std::allocator<bdId>_> *)&pit);
  }
  else {
    this_local._4_4_ = 0;
  }
  bdConnectionRequest::~bdConnectionRequest((bdConnectionRequest *)local_f0);
  return this_local._4_4_;
}

Assistant:

int bdConnectManager::requestConnection_direct(struct sockaddr_in *laddr, bdNodeId *target) {

#ifdef DEBUG_NODE_CONNECTION
	std::cerr << "bdConnectManager::requestConnection_direct()";
	std::cerr << std::endl;
#endif
	/* create a bdConnect, and put into the queue */
	bdConnectionRequest connreq;
	
	if (checkExistingConnectionAttempt(target)) {
#ifdef DEBUG_NODE_CONNECTION
		std::cerr << "bdConnectManager::requestConnection_direct() Existing ConnectionRequest... NOOP";
		std::cerr << std::endl;
#endif
		return 0;
	}

	connreq.setupDirectConnection(laddr, target);

	std::list<bdId> goodProxies;
	std::list<bdId>::iterator pit;
	mQueryMgr->result(target, goodProxies);
	for (pit = goodProxies.begin(); pit != goodProxies.end(); pit++)
		connreq.mGoodProxies.push_back(bdProxyId(*pit, BD_PI_SRC_QUERYRESULT, 0));

	/* now look in the bdSpace as well */
	if (connreq.mGoodProxies.size() < MIN_START_DIRECT_COUNT) {
		int number = CONNECT_NUM_PROXY_ATTEMPTS;
		int with_flag = BITDHT_PEER_STATUS_DHT_ENGINE_VERSION;
		std::list<bdId> matchIds;
		std::list<bdId>::iterator it;
		std::list<bdProxyId>::iterator git;
		
		mNodeSpace->find_node(target, number, matchIds, with_flag);

		/* merge lists (costly should use sets or something) */
		for (it = matchIds.begin(); it != matchIds.end(); it++) {
			for (git = connreq.mGoodProxies.begin(); git != connreq.mGoodProxies.end(); git++)
				if (git->id == *it)
					break;
			if (git == connreq.mGoodProxies.end())
				connreq.mGoodProxies.push_back(bdProxyId(*it, BD_PI_SRC_NODESPACE_ENGINEVERSION, 0));
		}
	}

	/* Actually if we lots of ids at this point... its likely that something is wrong 
	 */

	if (connreq.mGoodProxies.size() > 1) {
		std::cerr << "bdConnectManager::requestConnection_direct() ERROR Multiple Peers for DIRECT connection";
		std::cerr << std::endl;
	}

#ifdef DEBUG_NODE_CONNECTION
	std::cerr << "bdConnectManager::requestConnection_direct() CRINITSTATE Init Connection State";
	std::cerr << std::endl;
	std::cerr << connreq;
	std::cerr << std::endl;
#endif

	/* push connect onto queue, for later completion */

	mConnectionRequests[*target] = connreq;

	/* connection continued via iterator */
	return 1;
}